

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkUpdateLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  uint uVar1;
  void **ppvVar2;
  Abc_Obj_t *pObj;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  uint Level;
  long lVar8;
  ulong uVar9;
  
  uVar1 = *(uint *)&pObjNew->field_0x14;
  Level = uVar1 >> 0xc;
  uVar3 = Abc_ObjLevelNew(pObjNew);
  if (Level != uVar3) {
    iVar4 = vLevels->nSize;
    if (0 < (long)iVar4) {
      ppvVar2 = vLevels->pArray;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar7] + 4) = 0;
        lVar7 = lVar7 + 1;
      } while (iVar4 != lVar7);
    }
    Vec_VecPush(vLevels,Level,pObjNew);
    pObjNew->field_0x14 = pObjNew->field_0x14 | 0x10;
    uVar5 = (ulong)(uint)vLevels->nSize;
    if ((int)Level < vLevels->nSize) {
      uVar9 = (ulong)(uVar1 >> 0xc);
      do {
        if ((long)(int)uVar5 <= (long)uVar9) {
LAB_0031d2f4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        pvVar6 = vLevels->pArray[uVar9];
        if (0 < *(int *)((long)pvVar6 + 4)) {
          lVar7 = 0;
          do {
            pObj = *(Abc_Obj_t **)(*(long *)((long)pvVar6 + 8) + lVar7 * 8);
            uVar1 = *(uint *)&pObj->field_0x14;
            *(uint *)&pObj->field_0x14 = uVar1 & 0xffffffef;
            if (uVar9 != uVar1 >> 0xc) {
              __assert_fail("Abc_ObjLevel(pTemp) == Lev",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                            ,0x514,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
            }
            uVar3 = Abc_ObjLevelNew(pObj);
            *(uint *)&pObj->field_0x14 = uVar1 & 0xfef | uVar3 << 0xc;
            if (uVar9 != (uVar3 & 0xfffff)) {
              iVar4 = (pObj->vFanouts).nSize;
              if (0 < iVar4) {
                lVar8 = 0;
                do {
                  pvVar6 = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
                  uVar1 = *(uint *)((long)pvVar6 + 0x14);
                  if (((uVar1 & 0x10) == 0) && ((uVar1 & 0xf) - 5 < 0xfffffffe)) {
                    if (uVar1 >> 0xc < uVar9) {
                      __assert_fail("Abc_ObjLevel(pFanout) >= Lev",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                                    ,0x51e,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
                    }
                    Vec_VecPush(vLevels,uVar1 >> 0xc,pvVar6);
                    *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) | 0x10;
                    iVar4 = (pObj->vFanouts).nSize;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < iVar4);
              }
            }
            uVar5 = (ulong)vLevels->nSize;
            if ((long)uVar5 <= (long)uVar9) goto LAB_0031d2f4;
            lVar7 = lVar7 + 1;
            pvVar6 = vLevels->pArray[uVar9];
          } while (lVar7 < *(int *)((long)pvVar6 + 4));
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)(int)uVar5);
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanout, * pTemp;
    int LevelOld, Lev, k, m;
//    int Counter = 0, CounterMax = 0;
    // check if level has changed
    LevelOld = Abc_ObjLevel(pObjNew);
    if ( LevelOld == Abc_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
//        Counter--;
        pTemp->fMarkA = 0;
        assert( Abc_ObjLevel(pTemp) == Lev );
        Abc_ObjSetLevel( pTemp, Abc_ObjLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Abc_ObjForEachFanout( pTemp, pFanout, m )
        {
            if ( !Abc_ObjIsCo(pFanout) && !pFanout->fMarkA )
            {
                assert( Abc_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( vLevels, Abc_ObjLevel(pFanout), pFanout );
//                Counter++;
//                CounterMax = Abc_MaxFloat( CounterMax, Counter );
                pFanout->fMarkA = 1;
            }
        }
    }
//    printf( "%d ", CounterMax );
}